

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.h
# Opt level: O0

void __thiscall cmake::AddCacheEntry(cmake *this,string *key,char *value,char *helpString,int type)

{
  bool local_6d;
  allocator<char> local_59;
  string local_58;
  cmValue local_38;
  int local_2c;
  char *pcStack_28;
  int type_local;
  char *helpString_local;
  char *value_local;
  string *key_local;
  cmake *this_local;
  
  local_2c = type;
  pcStack_28 = helpString;
  helpString_local = value;
  value_local = (char *)key;
  key_local = (string *)this;
  if (value == (char *)0x0) {
    cmValue::cmValue(&local_38,(nullptr_t)0x0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,value,&local_59);
    cmValue::cmValue(&local_38,&local_58);
  }
  local_6d = value != (char *)0x0;
  AddCacheEntry(this,key,local_38,pcStack_28,local_2c);
  if (local_6d) {
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  return;
}

Assistant:

void AddCacheEntry(const std::string& key, const char* value,
                     const char* helpString, int type)
  {
    this->AddCacheEntry(key,
                        value ? cmValue(std::string(value)) : cmValue(nullptr),
                        helpString, type);
  }